

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFacetedBrepWithVoids::~IfcFacetedBrepWithVoids
          (IfcFacetedBrepWithVoids *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].super_IfcManifoldSolidBrep.super_IfcSolidModel.field_0x40 =
       &PTR__IfcFacetedBrepWithVoids_00983b58;
  *(undefined ***)
   &(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    field_0x28 = &PTR__IfcFacetedBrepWithVoids_00983c20;
  *(undefined ***)&this[-1].super_IfcManifoldSolidBrep.field_0x50 =
       &PTR__IfcFacetedBrepWithVoids_00983b80;
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcFacetedBrepWithVoids_00983ba8;
  *(undefined ***)&this[-1].field_0x70 = &PTR__IfcFacetedBrepWithVoids_00983bd0;
  (this->super_IfcManifoldSolidBrep).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFacetedBrepWithVoids_00983bf8;
  pvVar1 = *(void **)&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.
                      super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.
                                     super_IfcGeometricRepresentationItem.
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x20 - (long)pvVar1);
  }
  operator_delete(&this[-1].super_IfcManifoldSolidBrep.super_IfcSolidModel.field_0x40,0x88);
  return;
}

Assistant:

IfcFacetedBrepWithVoids() : Object("IfcFacetedBrepWithVoids") {}